

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O1

int xercesc_4_0::Base64::getDataLength(XMLCh *inputData,MemoryManager *manager,Conformance conform)

{
  XMLByte *pXVar1;
  XMLSize_t retLen;
  XMLSize_t local_10;
  
  local_10 = 0;
  pXVar1 = decodeToXMLByte(inputData,&local_10,manager,conform);
  if (pXVar1 == (XMLByte *)0x0) {
    local_10._0_4_ = -1;
  }
  else {
    if (manager == (MemoryManager *)0x0) {
      operator_delete(pXVar1);
    }
    else {
      (*manager->_vptr_MemoryManager[4])(manager,pXVar1);
    }
  }
  return (int)local_10;
}

Assistant:

int Base64::getDataLength(const XMLCh*         const inputData
                        ,       MemoryManager* const manager
                        ,       Conformance          conform )

{
    XMLSize_t retLen = 0;
    XMLByte* decodedData = decodeToXMLByte(inputData, &retLen, manager, conform);

    if ( !decodedData )
        return -1;
    else
    {
        returnExternalMemory(manager, decodedData);
        return (int)retLen;
    }
}